

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double get_number(string *s)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  float local_1c;
  long lStack_18;
  float result;
  size_t p;
  string *s_local;
  
  p = (size_t)s;
  lStack_18 = std::__cxx11::string::find((char)s,0x2c);
  if (lStack_18 != -1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[](p);
    *puVar1 = 0x2e;
  }
  uVar2 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar2,"%f",&local_1c);
  return ((double)local_1c * 3.141592653589793) / 180.0;
}

Assistant:

double get_number(std::string& s)
{
    size_t p = s.find(',');
    if (std::string::npos != p)
    {
        s[p] = '.';
    }
    float result;
    sscanf(s.c_str(), "%f", &result);
    return result*M_PI/180;
}